

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O2

int64_t __thiscall SharedMemRingBuffer::GetMinIndexOfConsumers(SharedMemRingBuffer *this)

{
  long lVar1;
  bool bVar2;
  int i;
  long lVar3;
  int64_t iVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0x7fffffffffffffff;
  bVar6 = false;
  for (lVar3 = 0;
      lVar3 < (this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
              super___atomic_base<int>._M_i; lVar3 = lVar3 + 1) {
    lVar1 = this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[lVar3].
            super___atomic_base<long>._M_i;
    bVar2 = lVar1 < lVar5;
    if (lVar1 < lVar5) {
      lVar5 = lVar1;
    }
    bVar6 = (bool)(bVar6 | bVar2);
  }
  iVar4 = 0;
  if (bVar6) {
    iVar4 = lVar5;
  }
  return iVar4;
}

Assistant:

int64_t SharedMemRingBuffer::GetMinIndexOfConsumers()
{
    int64_t min_index = INT64_MAX ;
    bool is_found = false;
    for(int i = 0; i < ring_buffer_status_on_shared_mem_->registered_consumer_count; i++) {
        int64_t nIndex = ring_buffer_status_on_shared_mem_->array_consumer_indexes[i];
        if( nIndex < min_index ) {
            min_index = nIndex;
            is_found = true;
        }
    }
    if(!is_found) {
        return 0;
    }
    return min_index ;
}